

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_f16c.cpp
# Opt level: O2

void ncnn::cast_fp32_to_fp16_sse_f16c(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  unsigned_short uVar8;
  ulong uVar9;
  undefined1 (*pauVar10) [32];
  long lVar11;
  int iVar12;
  undefined1 (*pauVar13) [16];
  int iVar14;
  ulong uVar15;
  
  iVar12 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
  uVar15 = 0;
  uVar9 = (ulong)(uint)bottom_blob->c;
  if (bottom_blob->c < 1) {
    uVar9 = uVar15;
  }
  for (; uVar15 != uVar9; uVar15 = uVar15 + 1) {
    pvVar2 = bottom_blob->data;
    sVar3 = bottom_blob->elemsize;
    sVar4 = bottom_blob->cstep;
    pauVar10 = (undefined1 (*) [32])(sVar4 * uVar15 * sVar3 + (long)pvVar2);
    pvVar5 = top_blob->data;
    sVar6 = top_blob->elemsize;
    sVar7 = top_blob->cstep;
    pauVar13 = (undefined1 (*) [16])(sVar7 * uVar15 * sVar6 + (long)pvVar5);
    lVar11 = 0;
    for (iVar14 = 0; iVar14 + 7 < iVar12; iVar14 = iVar14 + 8) {
      auVar1 = vcvtps2ph_f16c(*pauVar10,3);
      *pauVar13 = auVar1;
      pauVar10 = pauVar10 + 1;
      pauVar13 = pauVar13 + 1;
      lVar11 = lVar11 + 8;
    }
    for (; iVar14 + 3 < iVar12; iVar14 = iVar14 + 4) {
      vcvtps2ph_f16c(*(undefined1 (*) [16])*pauVar10,3);
      pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
      lVar11 = lVar11 + 4;
    }
    for (; (int)lVar11 < iVar12; lVar11 = lVar11 + 1) {
      uVar8 = float32_to_float16(*(float *)((long)pvVar2 + lVar11 * 4 + sVar4 * sVar3 * uVar15));
      *(unsigned_short *)((long)pvVar5 + lVar11 * 2 + sVar7 * sVar6 * uVar15) = uVar8;
    }
  }
  return;
}

Assistant:

void cast_fp32_to_fp16_sse_f16c(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
    cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
}